

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<int,_1,1,0,_1,1>>
               (Matrix<int,__1,_1,_0,__1,_1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
               *src,assign_op<int,_int> *func)

{
  Scalar *__first;
  Index __n;
  scalar_constant_op<int> *this;
  int local_24;
  assign_op<int,_int> *local_20;
  assign_op<int,_int> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  *src_local;
  Matrix<int,__1,_1,_0,__1,_1> *dst_local;
  
  local_20 = func;
  func_local = (assign_op<int,_int> *)src;
  src_local = (CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
               *)dst;
  resize_if_allowed<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>,int,int>
            (dst,src,func);
  __first = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::data
                      ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)src_local);
  __n = EigenBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::size
                  ((EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)src_local);
  this = CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>
         ::functor((CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                    *)func_local);
  local_24 = scalar_constant_op<int>::operator()(this);
  std::fill_n<int*,long,int>(__first,__n,&local_24);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<typename DstXprType::Scalar>, DstXprType>& src, const internal::assign_op<typename DstXprType::Scalar,typename DstXprType::Scalar>& func)
{
  resize_if_allowed(dst, src, func);
  std::fill_n(dst.data(), dst.size(), src.functor()());
}